

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O2

int TIFFReadCustomDirectory(TIFF *tif,toff_t diroff,TIFFFieldArray *infoarray)

{
  ushort uVar1;
  short sVar2;
  uint16_t dircount;
  int iVar3;
  uint uVar4;
  TIFFReadDirEntryErr err;
  ulong uVar5;
  TIFFField *pTVar6;
  char *pcVar7;
  TIFFField *fip;
  TIFFDirEntry *dp;
  uint16_t uVar8;
  double dVar9;
  uint32_t local_54;
  UInt64Aligned_t m;
  uint32_t local_44;
  TIFFDirEntry *dir;
  ulong local_38;
  
  (*tif->tif_cleanup)(tif);
  _TIFFSetupFields(tif,infoarray);
  iVar3 = 0;
  dircount = TIFFFetchDirectory(tif,diroff,&dir,(uint64_t *)0x0);
  if (dircount == 0) {
    TIFFErrorExtR(tif,"TIFFReadCustomDirectory","Failed to read custom directory at offset %lu",
                  diroff);
  }
  else {
    TIFFFreeDirectory(tif);
    _TIFFmemset(&tif->tif_dir,0,0x158);
    TIFFReadDirectoryCheckOrder(tif,dir,dircount);
    dp = dir;
    for (uVar8 = 0; uVar8 != dircount; uVar8 = uVar8 + 1) {
      uVar1 = dp->tdir_tag;
      TIFFReadDirectoryFindFieldInfo(tif,uVar1,&local_54);
      uVar5 = (ulong)local_54;
      if (local_54 == 0xffffffff) {
        TIFFWarningExtR(tif,"TIFFReadCustomDirectory","Unknown field with tag %u (0x%x) encountered"
                        ,(ulong)uVar1,(ulong)uVar1);
        pTVar6 = _TIFFCreateAnonField(tif,(uint)dp->tdir_tag,(uint)dp->tdir_type);
        iVar3 = _TIFFMergeFields(tif,pTVar6,1);
        uVar1 = dp->tdir_tag;
        if (iVar3 == 0) {
          TIFFWarningExtR(tif,"TIFFReadCustomDirectory",
                          "Registering anonymous field with tag %u (0x%x) failed",(ulong)uVar1,
                          (ulong)uVar1);
          dp->tdir_ignore = '\x01';
          uVar5 = 0xffffffffffffffff;
        }
        else {
          TIFFReadDirectoryFindFieldInfo(tif,uVar1,&local_54);
          uVar5 = (ulong)local_54;
          if (local_54 == 0xffffffff) {
            __assert_fail("fii != FAILED_FII",
                          "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                          ,0x1424,
                          "int TIFFReadCustomDirectory(TIFF *, toff_t, const TIFFFieldArray *)");
          }
        }
      }
      if (dp->tdir_ignore == '\0') {
        pTVar6 = tif->tif_fields[uVar5 & 0xffffffff];
        if (pTVar6->field_bit != 0) {
          do {
            fip = pTVar6;
            local_54 = (uint32_t)uVar5;
            if ((fip->field_type == TIFF_NOTYPE) ||
               (uVar1 = dp->tdir_type, fip->field_type == (uint)uVar1)) {
              if (local_54 == 0xffff) {
                uVar1 = dp->tdir_type;
                goto LAB_00251dc5;
              }
              sVar2 = fip->field_readcount;
              if ((sVar2 != -3) && (sVar2 != -1)) {
                if (sVar2 == -2) {
                  uVar4 = (uint)(tif->tif_dir).td_samplesperpixel;
                }
                else {
                  uVar4 = (uint)sVar2;
                }
                uVar5 = (ulong)uVar4;
                if (dp->tdir_count < uVar5) {
                  pTVar6 = TIFFFieldWithTag(tif,(uint)dp->tdir_tag);
                  pcVar7 = "unknown tagname";
                  if (pTVar6 != (TIFFField *)0x0) {
                    pcVar7 = pTVar6->field_name;
                  }
                  TIFFWarningExtR(tif,tif->tif_name,
                                  "incorrect count for field \"%s\" (%lu, expecting %u); tag ignored"
                                  ,pcVar7,dp->tdir_count,uVar5);
                  goto LAB_00251ddd;
                }
                if (uVar5 < dp->tdir_count) {
                  local_38 = uVar5;
                  pTVar6 = TIFFFieldWithTag(tif,(uint)dp->tdir_tag);
                  pcVar7 = "unknown tagname";
                  if (pTVar6 != (TIFFField *)0x0) {
                    pcVar7 = pTVar6->field_name;
                  }
                  TIFFWarningExtR(tif,tif->tif_name,
                                  "incorrect count for field \"%s\" (%lu, expecting %u); tag trimmed"
                                  ,pcVar7,dp->tdir_count,local_38);
                  dp->tdir_count = local_38;
                  if (dp->tdir_ignore != '\0') goto LAB_00251de2;
                }
              }
              if (dp->tdir_tag == 0x9206) {
                iVar3 = TIFFFieldIsAnonymous(fip);
                if (iVar3 == 0) {
                  m.d = 0.0;
                  err = TIFFReadDirEntryErrCount;
                  if (dp->tdir_count == 1) {
                    err = TIFFReadDirEntryErrType;
                    if (dp->tdir_type == 5) {
                      uVar4 = tif->tif_flags;
                      if ((uVar4 >> 0x13 & 1) == 0) {
                        local_44 = (dp->tdir_offset).toff_long;
                        if ((char)uVar4 < '\0') {
                          TIFFSwabLong(&local_44);
                        }
                        err = TIFFReadDirEntryData(tif,(ulong)local_44,8,&m);
                        if (err != TIFFReadDirEntryErrOk) goto LAB_00251f35;
                        uVar4 = tif->tif_flags;
                      }
                      else {
                        m = *(UInt64Aligned_t *)&dp->tdir_offset;
                      }
                      if ((char)uVar4 < '\0') {
                        TIFFSwabArrayOfLong(m.i,2);
                      }
                      if (m.i[0] == 0) {
                        dVar9 = 0.0;
                      }
                      else {
                        dVar9 = -1.0;
                        if (m.i[1] != 0 && m.i[0] != 0xffffffff) {
                          dVar9 = (double)(m.l & 0xffffffff) / (double)m._4_4_;
                        }
                      }
                      TIFFSetField(tif,(uint)dp->tdir_tag,dVar9);
                      goto LAB_00251de2;
                    }
                  }
LAB_00251f35:
                  TIFFReadDirEntryOutputErr(tif,err,"TIFFFetchSubjectDistance","SubjectDistance",1);
                  goto LAB_00251de2;
                }
              }
              TIFFFetchNormalTag(tif,dp,1);
              goto LAB_00251de2;
            }
            uVar5 = (ulong)(local_54 + 1);
          } while ((tif->tif_nfields != uVar5) &&
                  (pTVar6 = tif->tif_fields[uVar5], pTVar6->field_tag == (uint)dp->tdir_tag));
          local_54 = 0xffff;
LAB_00251dc5:
          TIFFWarningExtR(tif,"TIFFReadCustomDirectory","Wrong data type %u for \"%s\"; tag ignored"
                          ,(ulong)uVar1,fip->field_name);
        }
LAB_00251ddd:
        dp->tdir_ignore = '\x01';
      }
LAB_00251de2:
      dp = dp + 1;
    }
    tif->tif_setdirectory_force_absolute = 1;
    iVar3 = 1;
    if (dir != (TIFFDirEntry *)0x0) {
      _TIFFfreeExt(tif,dir);
    }
  }
  return iVar3;
}

Assistant:

int TIFFReadCustomDirectory(TIFF *tif, toff_t diroff,
                            const TIFFFieldArray *infoarray)
{
    static const char module[] = "TIFFReadCustomDirectory";
    TIFFDirEntry *dir;
    uint16_t dircount;
    TIFFDirEntry *dp;
    uint16_t di;
    const TIFFField *fip;
    uint32_t fii;
    (*tif->tif_cleanup)(tif); /* cleanup any previous compression state */
    _TIFFSetupFields(tif, infoarray);
    dircount = TIFFFetchDirectory(tif, diroff, &dir, NULL);
    if (!dircount)
    {
        TIFFErrorExtR(tif, module,
                      "Failed to read custom directory at offset %" PRIu64,
                      diroff);
        return 0;
    }
    TIFFFreeDirectory(tif);
    _TIFFmemset(&tif->tif_dir, 0, sizeof(TIFFDirectory));
    TIFFReadDirectoryCheckOrder(tif, dir, dircount);
    for (di = 0, dp = dir; di < dircount; di++, dp++)
    {
        TIFFReadDirectoryFindFieldInfo(tif, dp->tdir_tag, &fii);
        if (fii == FAILED_FII)
        {
            TIFFWarningExtR(tif, module,
                            "Unknown field with tag %" PRIu16 " (0x%" PRIx16
                            ") encountered",
                            dp->tdir_tag, dp->tdir_tag);
            if (!_TIFFMergeFields(
                    tif,
                    _TIFFCreateAnonField(tif, dp->tdir_tag,
                                         (TIFFDataType)dp->tdir_type),
                    1))
            {
                TIFFWarningExtR(tif, module,
                                "Registering anonymous field with tag %" PRIu16
                                " (0x%" PRIx16 ") failed",
                                dp->tdir_tag, dp->tdir_tag);
                dp->tdir_ignore = TRUE;
            }
            else
            {
                TIFFReadDirectoryFindFieldInfo(tif, dp->tdir_tag, &fii);
                assert(fii != FAILED_FII);
            }
        }
        if (!dp->tdir_ignore)
        {
            fip = tif->tif_fields[fii];
            if (fip->field_bit == FIELD_IGNORE)
                dp->tdir_ignore = TRUE;
            else
            {
                /* check data type */
                while ((fip->field_type != TIFF_ANY) &&
                       (fip->field_type != dp->tdir_type))
                {
                    fii++;
                    if ((fii == tif->tif_nfields) ||
                        (tif->tif_fields[fii]->field_tag !=
                         (uint32_t)dp->tdir_tag))
                    {
                        fii = 0xFFFF;
                        break;
                    }
                    fip = tif->tif_fields[fii];
                }
                if (fii == 0xFFFF)
                {
                    TIFFWarningExtR(tif, module,
                                    "Wrong data type %" PRIu16
                                    " for \"%s\"; tag ignored",
                                    dp->tdir_type, fip->field_name);
                    dp->tdir_ignore = TRUE;
                }
                else
                {
                    /* check count if known in advance */
                    if ((fip->field_readcount != TIFF_VARIABLE) &&
                        (fip->field_readcount != TIFF_VARIABLE2))
                    {
                        uint32_t expected;
                        if (fip->field_readcount == TIFF_SPP)
                            expected =
                                (uint32_t)tif->tif_dir.td_samplesperpixel;
                        else
                            expected = (uint32_t)fip->field_readcount;
                        if (!CheckDirCount(tif, dp, expected))
                            dp->tdir_ignore = TRUE;
                    }
                }
            }
            if (!dp->tdir_ignore)
            {
                switch (dp->tdir_tag)
                {
                    case EXIFTAG_SUBJECTDISTANCE:
                        if (!TIFFFieldIsAnonymous(fip))
                        {
                            /* should only be called on a Exif directory */
                            /* when exifFields[] is active */
                            (void)TIFFFetchSubjectDistance(tif, dp);
                        }
                        else
                        {
                            (void)TIFFFetchNormalTag(tif, dp, TRUE);
                        }
                        break;
                    default:
                        (void)TIFFFetchNormalTag(tif, dp, TRUE);
                        break;
                }
            } /*-- if (!dp->tdir_ignore) */
        }
    }
    /* To be able to return from SubIFD or custom-IFD to main-IFD */
    tif->tif_setdirectory_force_absolute = TRUE;
    if (dir)
        _TIFFfreeExt(tif, dir);
    return 1;
}